

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::RandomUniformCase::test
          (RandomUniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  deUint32 programGL_00;
  UniformCollection *this_00;
  TestLog *log_00;
  bool local_3e4;
  bool local_3e3;
  bool local_3e2;
  bool local_3e1;
  byte local_3d3;
  allocator<char> local_3d1;
  undefined1 local_3d0 [6];
  bool success_7;
  allocator<char> local_3a9;
  string local_3a8;
  ScopedLogSection local_388;
  ScopedLogSection section_8;
  undefined1 local_378 [6];
  bool success_6;
  allocator<char> local_351;
  string local_350;
  ScopedLogSection local_330;
  ScopedLogSection section_7;
  undefined1 local_320 [6];
  bool success_5;
  allocator<char> local_2f9;
  string local_2f8;
  ScopedLogSection local_2d8;
  ScopedLogSection section_6;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  ScopedLogSection local_280;
  ScopedLogSection section_5;
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  uniformValues;
  undefined1 local_258 [6];
  bool success_4;
  allocator<char> local_231;
  string local_230;
  ScopedLogSection local_210;
  ScopedLogSection section_4;
  undefined1 local_200 [6];
  bool success_3;
  allocator<char> local_1d9;
  string local_1d8;
  ScopedLogSection local_1b8;
  ScopedLogSection section_3;
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  uniformDefaultValues;
  undefined1 local_190 [6];
  bool success_2;
  allocator<char> local_169;
  string local_168;
  ScopedLogSection local_148;
  ScopedLogSection section_2;
  undefined1 local_138 [6];
  bool success_1;
  allocator<char> local_111;
  string local_110;
  ScopedLogSection local_f0;
  ScopedLogSection section_1;
  undefined1 local_e0 [6];
  bool success;
  allocator<char> local_a9;
  string local_a8;
  ScopedLogSection local_88;
  ScopedLogSection section;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniformsiv;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniform;
  TestLog *log;
  deUint32 programGL;
  bool local_3a;
  bool performRenderTest;
  bool performCompareUniformValues;
  bool performAssignUniforms;
  bool performCheckUniformDefaultValues;
  bool performGetUniforms;
  bool performUniformVsUniformsivComparison;
  bool performGetActiveUniformsiv;
  bool performGetActiveUniforms;
  bool renderingPossible;
  Random *rnd_local;
  ShaderProgram *program_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
  *basicUniformReportsRef_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  RandomUniformCase *this_local;
  
  local_3d3 = 1;
  if ((*(uint *)&(this->super_UniformCase).super_CallLogWrapper.field_0x14 & 0x100) != 0) {
    this_00 = de::SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>
              ::operator->(&(this->super_UniformCase).m_uniformCollection);
    bVar1 = anon_unknown_1::UniformCollection::containsSeveralSamplerTypes(this_00);
    local_3d3 = bVar1 ^ 0xff;
  }
  local_3a = de::Random::getBool(rnd);
  bVar1 = de::Random::getBool(rnd);
  local_3e1 = false;
  if ((local_3a) && (local_3e1 = false, bVar1)) {
    local_3e1 = de::Random::getBool(rnd);
  }
  bVar2 = de::Random::getBool(rnd);
  local_3e2 = false;
  if (bVar2) {
    local_3e2 = de::Random::getBool(rnd);
  }
  bVar3 = de::Random::getBool(rnd);
  local_3e3 = false;
  if ((bVar2) && (local_3e3 = false, bVar3)) {
    local_3e3 = de::Random::getBool(rnd);
  }
  local_3e4 = false;
  if (((local_3d3 & 1) != 0) && (local_3e4 = false, bVar3)) {
    local_3e4 = de::Random::getBool(rnd);
  }
  programGL_00 = glu::ShaderProgram::getProgram(program);
  log_00 = tcu::TestContext::getLog
                     ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  if (((((!local_3a) && (!bVar1)) && (local_3e1 == false)) && ((!bVar2 && (local_3e2 == false)))) &&
     ((!bVar3 && ((local_3e3 == false && (local_3e4 == false)))))) {
    local_3a = true;
  }
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
            *)&reportsUniformsiv.
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
            *)&section);
  if (local_3a == false) {
LAB_01d943c5:
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"InfoGetActiveUniformsiv",&local_111);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_138,
                 "Uniform information queries with glGetIndices() and glGetActiveUniformsiv()",
                 (allocator<char> *)((long)&section_2.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_f0,log_00,&local_110,(string *)local_138);
      std::__cxx11::string::~string((string *)local_138);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      section_2.m_log._6_1_ =
           UniformCase::getActiveUniformsiv
                     (&this->super_UniformCase,
                      (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                       *)&section,basicUniformReportsRef,programGL_00);
      if (!(bool)section_2.m_log._6_1_) {
        this_local._7_1_ = 0;
      }
      section_1.m_log._1_3_ = 0;
      section_1.m_log._0_1_ = !(bool)section_2.m_log._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
      if ((uint)section_1.m_log != 0) goto LAB_01d9476e;
    }
    if (local_3e1 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"CompareUniformVsUniformsiv",&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_190,
                 "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()",
                 (allocator<char> *)
                 ((long)&uniformDefaultValues.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_148,log_00,&local_168,(string *)local_190);
      std::__cxx11::string::~string((string *)local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&uniformDefaultValues.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      uniformDefaultValues.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
           UniformCase::uniformVsUniformsivComparison
                     (&this->super_UniformCase,
                      (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                       *)&reportsUniformsiv.
                          super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                       *)&section);
      if (!(bool)uniformDefaultValues.
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_) {
        this_local._7_1_ = 0;
      }
      section_1.m_log._1_3_ = 0;
      section_1.m_log._0_1_ =
           !(bool)uniformDefaultValues.
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_148);
      if ((uint)section_1.m_log != 0) goto LAB_01d9476e;
    }
    section_1.m_log._0_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"InfoGetActiveUniform",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,"Uniform information queries with glGetActiveUniform()",
               (allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_88,log_00,&local_a8,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    section_1.m_log._6_1_ =
         UniformCase::getActiveUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                     *)&reportsUniformsiv.
                        super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,basicUniformReportsRef,
                    programGL_00);
    if (!(bool)section_1.m_log._6_1_) {
      this_local._7_1_ = 0;
    }
    section_1.m_log._1_3_ = 0;
    section_1.m_log._0_1_ = !(bool)section_1.m_log._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_88);
    if ((uint)section_1.m_log == 0) goto LAB_01d943c5;
  }
LAB_01d9476e:
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             *)&section);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             *)&reportsUniformsiv.
                super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((uint)section_1.m_log != 0) goto LAB_01d952be;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ::vector((vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
            *)&section_3);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"GetUniformDefaults",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_200,"Uniform default value query",
               (allocator<char> *)((long)&section_4.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_1b8,log_00,&local_1d8,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_4.m_log + 7));
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    section_4.m_log._6_1_ =
         UniformCase::getUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                     *)&section_3,basicUniforms,programGL_00);
    if (!(bool)section_4.m_log._6_1_) {
      this_local._7_1_ = 0;
    }
    section_1.m_log._1_3_ = 0;
    section_1.m_log._0_1_ = !(bool)section_4.m_log._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_1b8);
    if ((uint)section_1.m_log == 0) goto LAB_01d9498a;
  }
  else {
LAB_01d9498a:
    if (local_3e2 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"DefaultValueCheck",&local_231);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_258,"Verify that the uniforms have correct initial values (zeros)",
                 (allocator<char> *)
                 ((long)&uniformValues.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_210,log_00,&local_230,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&uniformValues.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      uniformValues.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
           UniformCase::checkUniformDefaultValues
                     (&this->super_UniformCase,
                      (vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                       *)&section_3,basicUniforms);
      if (!(bool)uniformValues.
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_) {
        this_local._7_1_ = 0;
      }
      section_1.m_log._1_3_ = 0;
      section_1.m_log._0_1_ =
           !(bool)uniformValues.
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_210);
      if ((uint)section_1.m_log != 0) goto LAB_01d94b63;
    }
    section_1.m_log._0_4_ = 0;
  }
LAB_01d94b63:
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector((vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
             *)&section_3);
  if ((uint)section_1.m_log != 0) goto LAB_01d952be;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ::vector((vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
            *)&section_5);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"UniformAssign",&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"Uniform value assignments",
               (allocator<char> *)((long)&section_6.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_280,log_00,&local_2a0,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_6.m_log + 7));
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    UniformCase::assignUniforms(&this->super_UniformCase,basicUniforms,programGL_00,rnd);
    tcu::ScopedLogSection::~ScopedLogSection(&local_280);
  }
  if (local_3e3 == false) {
LAB_01d950b8:
    section_1.m_log._0_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"GetUniforms",&local_2f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_320,"Uniform value query",
               (allocator<char> *)((long)&section_7.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_2d8,log_00,&local_2f8,(string *)local_320);
    std::__cxx11::string::~string((string *)local_320);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_7.m_log + 7));
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    section_7.m_log._6_1_ =
         UniformCase::getUniforms
                   (&this->super_UniformCase,
                    (vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                     *)&section_5,basicUniforms,programGL_00);
    if (!(bool)section_7.m_log._6_1_) {
      this_local._7_1_ = 0;
    }
    section_1.m_log._1_3_ = 0;
    section_1.m_log._0_1_ = !(bool)section_7.m_log._6_1_;
    tcu::ScopedLogSection::~ScopedLogSection(&local_2d8);
    if ((uint)section_1.m_log == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"ValueCheck",&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_378,"Verify that the reported values match the assigned values",
                 (allocator<char> *)((long)&section_8.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_330,log_00,&local_350,(string *)local_378);
      std::__cxx11::string::~string((string *)local_378);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_8.m_log + 7));
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      section_8.m_log._6_1_ =
           UniformCase::compareUniformValues
                     (&this->super_UniformCase,
                      (vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                       *)&section_5,basicUniforms);
      if (!(bool)section_8.m_log._6_1_) {
        this_local._7_1_ = 0;
      }
      section_1.m_log._1_3_ = 0;
      section_1.m_log._0_1_ = !(bool)section_8.m_log._6_1_;
      tcu::ScopedLogSection::~ScopedLogSection(&local_330);
      if ((uint)section_1.m_log == 0) goto LAB_01d950b8;
    }
  }
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector((vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
             *)&section_5);
  if ((uint)section_1.m_log == 0) {
    if (local_3e4 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,"RenderTest",&local_3a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3d0,"Render test",&local_3d1);
      tcu::ScopedLogSection::ScopedLogSection(&local_388,log_00,&local_3a8,(string *)local_3d0);
      std::__cxx11::string::~string((string *)local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator(&local_3a9);
      bVar1 = UniformCase::renderTest(&this->super_UniformCase,basicUniforms,program,rnd);
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      section_1.m_log._1_3_ = 0;
      section_1.m_log._0_1_ = !bVar1;
      tcu::ScopedLogSection::~ScopedLogSection(&local_388);
      if ((uint)section_1.m_log != 0) goto LAB_01d952be;
    }
    this_local._7_1_ = 1;
  }
LAB_01d952be:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RandomUniformCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	// \note Different sampler types may not be bound to same unit when rendering.
	const bool		renderingPossible						= (m_features & FEATURE_UNIFORMVALUE_ZERO) == 0 || !m_uniformCollection->containsSeveralSamplerTypes();

	bool			performGetActiveUniforms				= rnd.getBool();
	const bool		performGetActiveUniformsiv				= rnd.getBool();
	const bool		performUniformVsUniformsivComparison	= performGetActiveUniforms && performGetActiveUniformsiv && rnd.getBool();
	const bool		performGetUniforms						= rnd.getBool();
	const bool		performCheckUniformDefaultValues		= performGetUniforms && rnd.getBool();
	const bool		performAssignUniforms					= rnd.getBool();
	const bool		performCompareUniformValues				= performGetUniforms && performAssignUniforms && rnd.getBool();
	const bool		performRenderTest						= renderingPossible && performAssignUniforms && rnd.getBool();
	const deUint32	programGL								= program.getProgram();
	TestLog&		log										= m_testCtx.getLog();

	if (!(performGetActiveUniforms || performGetActiveUniformsiv || performUniformVsUniformsivComparison || performGetUniforms || performCheckUniformDefaultValues || performAssignUniforms || performCompareUniformValues || performRenderTest))
		performGetActiveUniforms = true; // Do something at least.

#define PERFORM_AND_CHECK(CALL, SECTION_NAME, SECTION_DESCRIPTION)						\
	do																					\
	{																					\
		const ScopedLogSection section(log, (SECTION_NAME), (SECTION_DESCRIPTION));		\
		const bool success = (CALL);													\
		if (!success)																	\
			return false;																\
	} while (false)

	{
		vector<BasicUniformReportGL> reportsUniform;
		vector<BasicUniformReportGL> reportsUniformsiv;

		if (performGetActiveUniforms)
			PERFORM_AND_CHECK(getActiveUniforms(reportsUniform, basicUniformReportsRef, programGL), "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
		if (performGetActiveUniformsiv)
			PERFORM_AND_CHECK(getActiveUniformsiv(reportsUniformsiv, basicUniformReportsRef, programGL), "InfoGetActiveUniformsiv", "Uniform information queries with glGetIndices() and glGetActiveUniformsiv()");
		if (performUniformVsUniformsivComparison)
			PERFORM_AND_CHECK(uniformVsUniformsivComparison(reportsUniform, reportsUniformsiv), "CompareUniformVsUniformsiv", "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()");
	}

	{
		vector<VarValue> uniformDefaultValues;

		if (performGetUniforms)
			PERFORM_AND_CHECK(getUniforms(uniformDefaultValues, basicUniforms, programGL), "GetUniformDefaults", "Uniform default value query");
		if (performCheckUniformDefaultValues)
			PERFORM_AND_CHECK(checkUniformDefaultValues(uniformDefaultValues, basicUniforms), "DefaultValueCheck", "Verify that the uniforms have correct initial values (zeros)");
	}

	{
		vector<VarValue> uniformValues;

		if (performAssignUniforms)
		{
			const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
			assignUniforms(basicUniforms, programGL, rnd);
		}
		if (performCompareUniformValues)
		{
			PERFORM_AND_CHECK(getUniforms(uniformValues, basicUniforms, programGL), "GetUniforms", "Uniform value query");
			PERFORM_AND_CHECK(compareUniformValues(uniformValues, basicUniforms), "ValueCheck", "Verify that the reported values match the assigned values");
		}
	}

	if (performRenderTest)
		PERFORM_AND_CHECK(renderTest(basicUniforms, program, rnd), "RenderTest", "Render test");

#undef PERFORM_AND_CHECK

	return true;
}